

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O1

bool handler_selective_new_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *new_value)

{
  Am_Selective_New_Allowed_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  ulong in_RCX;
  byte unaff_BPL;
  anon_union_8_8_ea4c8939_for_value in_R8;
  Am_Value AVar4;
  Am_Value AVar5;
  Am_Value value;
  Am_Selective_Repeat_New_Method method;
  Am_Selective_New_Allowed_Method allowed_method;
  Am_Value local_a0;
  Am_Value *local_90;
  Am_Value *local_88;
  undefined1 local_80 [8];
  Am_Selective_Repeat_New_Method local_78;
  Am_Selective_New_Allowed_Method local_68;
  undefined1 local_50 [16];
  Am_Value local_40;
  
  local_68.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_68.Call = (Am_Selective_New_Allowed_Method_Type *)0x0;
  local_a0.type = 0;
  local_a0.value.wrapper_value = (Am_Wrapper *)0x0;
  local_90 = new_value;
  local_88 = new_selection;
  do {
    bVar2 = Am_Object::Valid(command_obj);
    if (!bVar2) {
LAB_001c15f4:
      unaff_BPL = 0;
      break;
    }
    pAVar3 = Am_Object::Get(command_obj,0x14d,4);
    Am_Selective_New_Allowed_Method::operator=(&local_68,pAVar3);
    pAVar1 = local_68.Call;
    if (local_68.Call != (Am_Selective_New_Allowed_Method_Type *)0x0) {
      Am_Object::Am_Object((Am_Object *)local_80,command_obj);
      Am_Value::Am_Value(&local_40,local_88);
      Am_Value::Am_Value((Am_Value *)local_50,local_90);
      AVar4.value.wrapper_value = (Am_Wrapper *)local_50;
      AVar4._0_8_ = &local_40;
      AVar5.value.wrapper_value = in_R8.wrapper_value;
      AVar5._0_8_ = in_RCX;
      bVar2 = (*pAVar1)((Am_Object_Data *)local_80,AVar4,AVar5);
      Am_Value::~Am_Value((Am_Value *)local_50);
      Am_Value::~Am_Value(&local_40);
      Am_Object::~Am_Object((Am_Object *)local_80);
      if (!bVar2) goto LAB_001c15f4;
    }
    local_78.from_wrapper = (Am_Method_Wrapper *)0x0;
    local_78.Call = (Am_Selective_Repeat_New_Method_Type *)0x0;
    pAVar3 = Am_Object::Get(command_obj,0x14a,4);
    Am_Selective_Repeat_New_Method::operator=(&local_78,pAVar3);
    if (local_78.Call == (Am_Selective_Repeat_New_Method_Type *)0x0) {
      pAVar3 = Am_Object::Get(command_obj,0x167,5);
      Am_Value::operator=(&local_a0,pAVar3);
      bVar2 = Am_Value::Valid(&local_a0);
      in_RCX = (ulong)CONCAT11((char)(local_a0.type >> 8),local_a0.type == 0xa001);
      if (!bVar2 || local_a0.type != 0xa001) {
        unaff_BPL = 0;
        goto LAB_001c15e6;
      }
      bVar2 = true;
      Am_Object::operator=(command_obj,&local_a0);
    }
    else {
      unaff_BPL = 1;
LAB_001c15e6:
      bVar2 = false;
    }
  } while (bVar2);
  Am_Value::~Am_Value(&local_a0);
  return (bool)(unaff_BPL & 1);
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 handler_selective_new_allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value new_value))
{
  Am_Selective_New_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_NEW_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj, new_selection, new_value)))
        return false;
    Am_Selective_Repeat_New_Method method;
    method =
        command_obj.Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;
    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}